

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

void __thiscall QMimeXMLProvider::addAllMimeTypes(QMimeXMLProvider *this,QList<QMimeType> *result)

{
  byte bVar1;
  Entry *pEVar2;
  QArrayData *data;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  bool bVar5;
  QMimeType *pQVar6;
  ulong uVar7;
  ulong uVar8;
  const_iterator __it;
  uint uVar9;
  Data *pDVar10;
  const_iterator __it_00;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  QMimeTypePrivate local_68;
  QMimeType local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar10 = (this->m_nameMimeTypeMap).d;
  if ((result->d).size == 0) {
    if (pDVar10 == (Data *)0x0) {
      pDVar10 = (Data *)0x0;
      uVar8 = 0;
LAB_004ad4d0:
      if (uVar8 == 0 && pDVar10 == (Data *)0x0) goto LAB_004ad5db;
    }
    else {
      if (pDVar10->spans->offsets[0] == 0xff) {
        uVar7 = 1;
        do {
          uVar8 = uVar7;
          if (pDVar10->numBuckets == uVar8) {
            pDVar10 = (Data *)0x0;
            uVar8 = 0;
            break;
          }
          uVar7 = uVar8 + 1;
        } while (pDVar10->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
        goto LAB_004ad4d0;
      }
      uVar8 = 0;
    }
    do {
      pEVar2 = pDVar10->spans[uVar8 >> 7].entries;
      bVar1 = pDVar10->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f];
      lVar11 = (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8;
      local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
      local_68.name.d.d = *(Data **)((pEVar2->storage).data + lVar11 + 0x20);
      local_68.name.d.ptr = *(char16_t **)((pEVar2->storage).data + lVar11 + 0x28);
      local_68.name.d.size = *(qsizetype *)((pEVar2->storage).data + lVar11 + 0x30);
      if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
        ;
        UNLOCK();
      }
      QMimeType::QMimeType(local_48,&local_68);
      QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                ((QMovableArrayOps<QMimeType> *)result,(result->d).size,local_48);
      QList<QMimeType>::end(result);
      QMimeType::~QMimeType(local_48);
      if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,2,0x10);
        }
      }
      do {
        if (pDVar10->numBuckets - 1 == uVar8) {
          uVar8 = 0;
          pDVar10 = (Data *)0x0;
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pDVar10->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
    } while ((uVar8 != 0) || (pDVar10 != (Data *)0x0));
    goto LAB_004ad5db;
  }
  if (pDVar10 == (Data *)0x0) {
    pDVar10 = (Data *)0x0;
    uVar8 = 0;
LAB_004ad12e:
    if (pDVar10 == (Data *)0x0 && uVar8 == 0) goto LAB_004ad5db;
  }
  else {
    if (pDVar10->spans->offsets[0] == 0xff) {
      uVar7 = 1;
      do {
        uVar8 = uVar7;
        if (pDVar10->numBuckets == uVar8) {
          pDVar10 = (Data *)0x0;
          uVar8 = 0;
          break;
        }
        uVar7 = uVar8 + 1;
      } while (pDVar10->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      goto LAB_004ad12e;
    }
    uVar8 = 0;
  }
  do {
    uVar7 = uVar8 >> 7;
    uVar9 = (uint)uVar8 & 0x7f;
    pEVar2 = pDVar10->spans[uVar7].entries;
    bVar1 = pDVar10->spans[uVar7].offsets[uVar9];
    lVar11 = (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8;
    data = *(QArrayData **)((pEVar2->storage).data + lVar11);
    pQVar3 = *(QArrayData **)((pEVar2->storage).data + lVar11 + 8);
    pcVar4 = *(char16_t **)((pEVar2->storage).data + lVar11 + 0x10);
    if (data == (QArrayData *)0x0) {
      __it_00.i = (result->d).ptr;
      pQVar6 = __it_00.i + (result->d).size;
      local_68._0_8_ = (QArrayData *)0x0;
    }
    else {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      __it_00.i = (result->d).ptr;
      lVar11 = (result->d).size;
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
      pQVar6 = __it_00.i + lVar11;
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_68._0_8_ = data;
    }
    lVar11 = (long)pQVar6 - (long)__it_00.i;
    local_68.name.d.d = (Data *)pQVar3;
    local_68.name.d.ptr = pcVar4;
    if (0 < lVar11 >> 5) {
      lVar12 = (lVar11 >> 5) + 1;
      do {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_68,__it_00);
        __it.i = __it_00.i;
        if (bVar5) goto LAB_004ad301;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_68,__it_00.i + 1);
        __it.i = __it_00.i + 1;
        if (bVar5) goto LAB_004ad301;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_68,__it_00.i + 2);
        __it.i = __it_00.i + 2;
        if (bVar5) goto LAB_004ad301;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_68,__it_00.i + 3);
        __it.i = __it_00.i + 3;
        if (bVar5) goto LAB_004ad301;
        __it_00.i = __it_00.i + 4;
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x20;
      } while (1 < lVar12);
    }
    lVar11 = lVar11 >> 3;
    if (lVar11 == 1) {
LAB_004ad2ee:
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                        ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                         &local_68,__it_00);
      __it.i = pQVar6;
      if (bVar5) {
        __it.i = __it_00.i;
      }
    }
    else {
      __it.i = __it_00.i;
      if (lVar11 == 2) {
LAB_004ad2cd:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_68,__it);
        if (!bVar5) {
          __it_00.i = __it.i + 1;
          goto LAB_004ad2ee;
        }
      }
      else {
        __it.i = pQVar6;
        if ((lVar11 == 3) &&
           (bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                    operator()((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                                *)&local_68,__it_00), __it.i = __it_00.i, !bVar5)) {
          __it.i = __it_00.i + 1;
          goto LAB_004ad2cd;
        }
      }
    }
LAB_004ad301:
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (data == (QArrayData *)0x0) {
      if (__it.i == (result->d).ptr + (result->d).size) goto LAB_004ad3b4;
    }
    else {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
      lVar11 = (result->d).size;
      pQVar6 = (result->d).ptr;
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
      if (__it.i == pQVar6 + lVar11) {
LAB_004ad3b4:
        pEVar2 = pDVar10->spans[uVar7].entries;
        bVar1 = pDVar10->spans[uVar7].offsets[uVar9];
        lVar11 = (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8;
        local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
        local_68.name.d.d = *(Data **)((pEVar2->storage).data + lVar11 + 0x20);
        local_68.name.d.ptr = *(char16_t **)((pEVar2->storage).data + lVar11 + 0x28);
        local_68.name.d.size = *(qsizetype *)((pEVar2->storage).data + lVar11 + 0x30);
        if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               1;
          UNLOCK();
        }
        QMimeType::QMimeType(local_48,&local_68);
        QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                  ((QMovableArrayOps<QMimeType> *)result,(result->d).size,local_48);
        QList<QMimeType>::end(result);
        QMimeType::~QMimeType(local_48);
        if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (data == (QArrayData *)0x0) goto LAB_004ad480;
      }
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
LAB_004ad480:
    do {
      if (pDVar10->numBuckets - 1 == uVar8) {
        pDVar10 = (Data *)0x0;
        uVar8 = 0;
        break;
      }
      uVar8 = uVar8 + 1;
    } while (pDVar10->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
  } while ((pDVar10 != (Data *)0x0) || (uVar8 != 0));
LAB_004ad5db:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    if (result.isEmpty()) { // fast path
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd();
             it != end; ++it) {
            result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    } else {
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd() ; it != end ; ++it) {
            const QString newMime = it.key();
            if (std::find_if(result.constBegin(), result.constEnd(), [newMime](const QMimeType &mime) -> bool { return mime.name() == newMime; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    }
}